

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O3

void __thiscall
DListBase<Memory::CustomHeap::Page,_RealCount>::RemoveElement<Memory::ArenaAllocator>
          (DListBase<Memory::CustomHeap::Page,_RealCount> *this,ArenaAllocator *allocator,
          Page *element)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  DListNode<Memory::CustomHeap::Page> *pDVar4;
  undefined4 *puVar5;
  char **buffer;
  
  buffer = &element[-1].address;
  pDVar4 = (DListNode<Memory::CustomHeap::Page> *)this;
  do {
    pDVar4 = (pDVar4->super_DListNodeBase<Memory::CustomHeap::Page>).next.node;
    if (pDVar4 == (DListNode<Memory::CustomHeap::Page> *)this) break;
  } while (pDVar4 != (DListNode<Memory::CustomHeap::Page> *)buffer);
  if (pDVar4 == (DListNode<Memory::CustomHeap::Page> *)this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pcVar1 = *buffer;
  **(long **)&element[-1].currentBucket = (long)pcVar1;
  *(undefined8 *)(pcVar1 + 8) = *(undefined8 *)&element[-1].currentBucket;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x38);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }